

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O3

NodeData __thiscall
google::protobuf::compiler::
SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::DFS
          (SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator> *this,
          Descriptor *descriptor)

{
  _Rb_tree_header *p_Var1;
  pointer *pppDVar2;
  iterator iVar3;
  pointer ppDVar4;
  long lVar5;
  int iVar6;
  LogMessage *pLVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  SCC *scc;
  mapped_type *pmVar10;
  ulong uVar11;
  _Base_ptr p_Var12;
  int iVar13;
  pointer ppDVar14;
  NodeData NVar15;
  Descriptor *dep;
  Descriptor *scc_desc;
  LogFinisher local_91;
  Descriptor *local_90;
  Descriptor *local_88;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_80;
  LogMessage local_68;
  
  p_Var9 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->cache_)._M_t._M_impl.super__Rb_tree_header;
  p_Var12 = &p_Var1->_M_header;
  local_90 = descriptor;
  if (p_Var9 != (_Base_ptr)0x0) {
    do {
      if (*(Descriptor **)(p_Var9 + 1) >= descriptor) {
        p_Var12 = p_Var9;
      }
      p_Var9 = (&p_Var9->_M_left)[*(Descriptor **)(p_Var9 + 1) < descriptor];
    } while (p_Var9 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var12 != p_Var1) && (*(Descriptor **)(p_Var12 + 1) <= descriptor)) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
                 ,0x5c);
      pLVar7 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (cache_.count(descriptor)) == (0): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar7);
      internal::LogMessage::~LogMessage(&local_68);
    }
  }
  pmVar8 = std::
           map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
           ::operator[](&this->cache_,&local_90);
  iVar6 = this->index_;
  this->index_ = iVar6 + 1;
  pmVar8->lowlink = iVar6;
  pmVar8->index = iVar6;
  iVar3._M_current =
       (this->stack_).
       super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->stack_).
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
    ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
              ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                *)&this->stack_,iVar3,&local_90);
  }
  else {
    *iVar3._M_current = local_90;
    pppDVar2 = &(this->stack_).
                super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppDVar2 = *pppDVar2 + 1;
  }
  cpp::MessageSCCAnalyzer::DepsGenerator::operator()(&local_80,(DepsGenerator *)&local_68,local_90);
  if (local_80.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppDVar14 = local_80.
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_88 = *ppDVar14;
      if (local_88 == (Descriptor *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
                   ,0x66);
        pLVar7 = internal::LogMessage::operator<<(&local_68,"CHECK failed: dep: ");
        internal::LogFinisher::operator=(&local_91,pLVar7);
        internal::LogMessage::~LogMessage(&local_68);
      }
      p_Var9 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var12 = &p_Var1->_M_header;
      if (p_Var9 == (_Base_ptr)0x0) {
LAB_002404c2:
        NVar15 = DFS(this,local_88);
        iVar13 = NVar15.lowlink;
        iVar6 = pmVar8->lowlink;
LAB_002404d2:
        if (iVar6 < iVar13) {
          iVar13 = iVar6;
        }
        pmVar8->lowlink = iVar13;
      }
      else {
        do {
          if (*(Descriptor **)(p_Var9 + 1) >= local_88) {
            p_Var12 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[*(Descriptor **)(p_Var9 + 1) < local_88];
        } while (p_Var9 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var12 == p_Var1) ||
           (local_88 < (Descriptor *)((_Rb_tree_header *)p_Var12)->_M_node_count))
        goto LAB_002404c2;
        pmVar10 = std::
                  map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
                  ::operator[](&this->cache_,&local_88);
        if (pmVar10->scc == (SCC *)0x0) {
          iVar6 = pmVar10->index;
          iVar13 = pmVar8->lowlink;
          goto LAB_002404d2;
        }
      }
      ppDVar14 = ppDVar14 + 1;
    } while (ppDVar14 !=
             local_80.
             super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_80.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (pmVar8->index == pmVar8->lowlink) {
    scc = CreateSCC(this);
    do {
      local_68._0_8_ =
           (this->stack_).
           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
      iVar3._M_current =
           (scc->descriptors).
           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (scc->descriptors).
          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
                  ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                    *)scc,iVar3,(Descriptor **)&local_68);
      }
      else {
        *iVar3._M_current = (Descriptor *)local_68._0_8_;
        pppDVar2 = &(scc->descriptors).
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppDVar2 = *pppDVar2 + 1;
      }
      pppDVar2 = &(this->stack_).
                  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppDVar2 = *pppDVar2 + -1;
      pmVar10 = std::
                map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::NodeData>_>_>
                ::operator[](&this->cache_,(key_type *)&local_68);
      pmVar10->scc = scc;
    } while ((Descriptor *)local_68._0_8_ != local_90);
    ppDVar14 = (scc->descriptors).
               super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppDVar4 = (scc->descriptors).
              super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppDVar14 != ppDVar4) {
      uVar11 = (long)ppDVar4 - (long)ppDVar14 >> 3;
      lVar5 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                (ppDVar14,ppDVar4,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                (ppDVar14,ppDVar4);
    }
    AddChildren(this,scc);
  }
  NVar15.scc = pmVar8->scc;
  NVar15.index = pmVar8->index;
  NVar15.lowlink = pmVar8->lowlink;
  return NVar15;
}

Assistant:

NodeData DFS(const Descriptor* descriptor) {
    // Must not have visited already.
    GOOGLE_DCHECK_EQ(cache_.count(descriptor), 0);

    // Mark visited by inserting in map.
    NodeData& result = cache_[descriptor];
    // Initialize data structures.
    result.index = result.lowlink = index_++;
    stack_.push_back(descriptor);

    // Recurse the fields / nodes in graph
    for (auto dep : DepsGenerator()(descriptor)) {
      GOOGLE_CHECK(dep);
      if (cache_.count(dep) == 0) {
        // unexplored node
        NodeData child_data = DFS(dep);
        result.lowlink = std::min(result.lowlink, child_data.lowlink);
      } else {
        NodeData child_data = cache_[dep];
        if (child_data.scc == nullptr) {
          // Still in the stack_ so we found a back edge
          result.lowlink = std::min(result.lowlink, child_data.index);
        }
      }
    }
    if (result.index == result.lowlink) {
      // This is the root of a strongly connected component
      SCC* scc = CreateSCC();
      while (true) {
        const Descriptor* scc_desc = stack_.back();
        scc->descriptors.push_back(scc_desc);
        // Remove from stack
        stack_.pop_back();
        cache_[scc_desc].scc = scc;

        if (scc_desc == descriptor) break;
      }

      // The order of descriptors is random and depends how this SCC was
      // discovered. In-order to ensure maximum stability we sort it by name.
      std::sort(scc->descriptors.begin(), scc->descriptors.end(),
                [](const Descriptor* a, const Descriptor* b) {
                  return a->full_name() < b->full_name();
                });
      AddChildren(scc);
    }
    return result;
  }